

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O0

int Cba_BlastLessSigned(Gia_Man_t *pNew,int *pArg0,int *pArg1,int nBits)

{
  int iCtrl;
  int iData0;
  int iVar1;
  int iDiffSign;
  int nBits_local;
  int *pArg1_local;
  int *pArg0_local;
  Gia_Man_t *pNew_local;
  
  iCtrl = Gia_ManHashXor(pNew,pArg0[nBits + -1],pArg1[nBits + -1]);
  iVar1 = pArg0[nBits + -1];
  iData0 = Cba_BlastLess(pNew,pArg0,pArg1,nBits + -1);
  iVar1 = Gia_ManHashMux(pNew,iCtrl,iVar1,iData0);
  return iVar1;
}

Assistant:

int Cba_BlastLessSigned( Gia_Man_t * pNew, int * pArg0, int * pArg1, int nBits )
{
    int iDiffSign = Gia_ManHashXor( pNew, pArg0[nBits-1], pArg1[nBits-1] );
    return Gia_ManHashMux( pNew, iDiffSign, pArg0[nBits-1], Cba_BlastLess(pNew, pArg0, pArg1, nBits-1) );
}